

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

void __thiscall
ezc3d::c3d::analog(c3d *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *channelNames)

{
  size_t sVar1;
  size_type sVar2;
  Header *this_00;
  SubFrame *this_01;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *in_stack_00000020;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000028;
  c3d *in_stack_00000030;
  size_t f;
  size_t sf;
  size_t i;
  Frame frame;
  Channel emptyChannel;
  SubFrame dummy_subframes;
  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> dummy_frames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00001d60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00001d68;
  c3d *in_stack_00001d70;
  value_type *this_02;
  Analogs *in_stack_ffffffffffffff20;
  Channel *in_stack_ffffffffffffff28;
  SubFrame *subframe;
  SubFrame *in_stack_ffffffffffffff30;
  value_type *local_a0;
  SubFrame *local_98;
  ulong local_90;
  Frame *in_stack_ffffffffffffff90;
  Channel local_58 [9];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  data((c3d *)0x14ea79);
  sVar1 = DataNS::Data::nbFrames((Data *)0x14ea81);
  if (sVar1 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x14ece1);
    updateParameters(in_stack_00001d70,in_stack_00001d68,in_stack_00001d60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff20);
  }
  else {
    std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::vector
              ((vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *)0x14ea98);
    DataNS::AnalogsNS::SubFrame::SubFrame((SubFrame *)0x14eaa5);
    DataNS::AnalogsNS::Channel::Channel(local_58);
    DataNS::AnalogsNS::Channel::data(local_58,0.0);
    DataNS::Frame::Frame(in_stack_ffffffffffffff90);
    local_90 = 0;
    while( true ) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_10);
      if (sVar2 <= local_90) break;
      DataNS::AnalogsNS::SubFrame::channel
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (size_t)in_stack_ffffffffffffff20);
      local_90 = local_90 + 1;
    }
    local_98 = (SubFrame *)0x0;
    while( true ) {
      subframe = local_98;
      this_00 = header((c3d *)0x14eba7);
      this_01 = (SubFrame *)Header::nbAnalogByFrame(this_00);
      if (this_01 <= subframe) break;
      in_stack_ffffffffffffff20 = DataNS::Frame::analogs((Frame *)0x14ebcf);
      DataNS::AnalogsNS::Analogs::subframe
                ((Analogs *)this_01,subframe,(size_t)in_stack_ffffffffffffff20);
      local_98 = (SubFrame *)
                 ((long)&(local_98->_channels).
                         super__Vector_base<ezc3d::DataNS::AnalogsNS::Channel,_std::allocator<ezc3d::DataNS::AnalogsNS::Channel>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    local_a0 = (value_type *)0x0;
    while( true ) {
      this_02 = local_a0;
      data((c3d *)0x14ec20);
      __x = (value_type *)DataNS::Data::nbFrames((Data *)0x14ec28);
      if (__x <= this_02) break;
      std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::push_back
                ((vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *)
                 in_stack_ffffffffffffff20,__x);
      local_a0 = (value_type *)
                 ((long)&(local_a0->_points).
                         super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 1);
    }
    analog(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    DataNS::Frame::~Frame(this_02);
    DataNS::AnalogsNS::SubFrame::~SubFrame((SubFrame *)0x14ec97);
    std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::~vector
              ((vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *)
               in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void ezc3d::c3d::analog(const std::vector<std::string> &channelNames) {
  if (data().nbFrames() > 0) {
    std::vector<ezc3d::DataNS::Frame> dummy_frames;
    ezc3d::DataNS::AnalogsNS::SubFrame dummy_subframes;
    ezc3d::DataNS::AnalogsNS::Channel emptyChannel;
    emptyChannel.data(0);
    ezc3d::DataNS::Frame frame;
    for (size_t i = 0; i < channelNames.size(); ++i) {
      dummy_subframes.channel(emptyChannel);
    }
    for (size_t sf = 0; sf < header().nbAnalogByFrame(); ++sf)
      frame.analogs().subframe(dummy_subframes);
    for (size_t f = 0; f < data().nbFrames(); ++f)
      dummy_frames.push_back(frame);
    analog(channelNames, dummy_frames);
  } else {
    updateParameters({}, channelNames);
  }
}